

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O2

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,0ul>::
execute<asio::detail::binder0<std::function<void()>>>
          (basic_executor_type<std::allocator<void>,0ul> *this,binder0<std::function<void_()>_> *f)

{
  _Manager_type p_Var1;
  bool bVar2;
  executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
  *op;
  function_type tmp;
  _Any_data local_38;
  executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
  *local_28;
  _Invoker_type local_20;
  
  if (((*(ulong *)this & 1) == 0) &&
     (bVar2 = asio::detail::scheduler::can_dispatch
                        (*(scheduler **)((*(ulong *)this & 0xfffffffffffffffc) + 8)), bVar2)) {
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_28 = (executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)0x0;
    local_20 = (f->handler_)._M_invoker;
    p_Var1 = (f->handler_).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_38._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(f->handler_).super__Function_base._M_functor;
      local_38._8_8_ = *(undefined8 *)((long)&(f->handler_).super__Function_base._M_functor + 8);
      (f->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
      (f->handler_)._M_invoker = (_Invoker_type)0x0;
      local_28 = (executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
                  *)p_Var1;
    }
    std::function<void_()>::operator()((function<void_()> *)&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    return;
  }
  local_38._M_unused._0_8_ = (undefined8)this;
  op = asio::detail::
       executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::ptr::allocate((allocator<void> *)this);
  local_28 = (executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
              *)0x0;
  local_38._8_8_ = op;
  asio::detail::
  executor_op<asio::detail::binder0<std::function<void()>>,std::allocator<void>,asio::detail::scheduler_operation>
  ::executor_op<asio::detail::binder0<std::function<void()>>>
            ((executor_op<asio::detail::binder0<std::function<void()>>,std::allocator<void>,asio::detail::scheduler_operation>
              *)op,f,(allocator<void> *)this);
  local_28 = op;
  asio::detail::scheduler::post_immediate_completion
            (*(scheduler **)((*(ulong *)this & 0xfffffffffffffffc) + 8),
             &op->super_scheduler_operation,SUB41(((uint)*(ulong *)this & 2) >> 1,0));
  local_38._8_8_ = 0;
  local_28 = (executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
              *)0x0;
  asio::detail::
  executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::~ptr((ptr *)&local_38);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits() & blocking_never) == 0 && context_ptr()->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      context_ptr()->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = {
      detail::addressof(static_cast<const Allocator&>(*this)),
      op::ptr::allocate(static_cast<const Allocator&>(*this)), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f),
      static_cast<const Allocator&>(*this));

  ASIO_HANDLER_CREATION((*context_ptr(), *p.p,
        "io_context", context_ptr(), 0, "execute"));

  context_ptr()->impl_.post_immediate_completion(p.p,
      (bits() & relationship_continuation) != 0);
  p.v = p.p = 0;
}